

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PopStyleVar(int count)

{
  ImGuiContext *pIVar1;
  ImGuiStyleMod *pIVar2;
  ImGuiStyleVarInfo *this;
  int *piVar3;
  int in_EDI;
  void *data;
  ImGuiStyleVarInfo *info;
  ImGuiStyleMod *backup;
  ImGuiContext *g;
  int local_4;
  
  pIVar1 = GImGui;
  local_4 = in_EDI;
  if ((GImGui->StyleVarStack).Size < in_EDI) {
    local_4 = (GImGui->StyleVarStack).Size;
  }
  for (; 0 < local_4; local_4 = local_4 + -1) {
    pIVar2 = ImVector<ImGuiStyleMod>::back(&pIVar1->StyleVarStack);
    this = GetStyleVarInfo(pIVar2->VarIdx);
    piVar3 = (int *)ImGuiStyleVarInfo::GetVarPtr(this,&pIVar1->Style);
    if ((this->Type == 8) && (this->Count == 1)) {
      *piVar3 = (pIVar2->field_1).BackupInt[0];
    }
    else if ((this->Type == 8) && (this->Count == 2)) {
      *piVar3 = (pIVar2->field_1).BackupInt[0];
      piVar3[1] = (pIVar2->field_1).BackupInt[1];
    }
    ImVector<ImGuiStyleMod>::pop_back(&pIVar1->StyleVarStack);
  }
  return;
}

Assistant:

void ImGui::PopStyleVar(int count)
{
    ImGuiContext& g = *GImGui;
    if (g.StyleVarStack.Size < count)
    {
        IM_ASSERT_USER_ERROR(g.StyleVarStack.Size > count, "Calling PopStyleVar() too many times: stack underflow.");
        count = g.StyleVarStack.Size;
    }
    while (count > 0)
    {
        // We avoid a generic memcpy(data, &backup.Backup.., GDataTypeSize[info->Type] * info->Count), the overhead in Debug is not worth it.
        ImGuiStyleMod& backup = g.StyleVarStack.back();
        const ImGuiStyleVarInfo* info = GetStyleVarInfo(backup.VarIdx);
        void* data = info->GetVarPtr(&g.Style);
        if (info->Type == ImGuiDataType_Float && info->Count == 1)      { ((float*)data)[0] = backup.BackupFloat[0]; }
        else if (info->Type == ImGuiDataType_Float && info->Count == 2) { ((float*)data)[0] = backup.BackupFloat[0]; ((float*)data)[1] = backup.BackupFloat[1]; }
        g.StyleVarStack.pop_back();
        count--;
    }
}